

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageProcessingQCOMDecoration
          (ValidationState_t *_,int id,Decoration decor)

{
  bool bVar1;
  uint32_t uVar2;
  Instruction *this;
  spv_result_t sVar3;
  string local_220;
  DiagnosticStream local_200;
  
  this = ValidationState_t::FindDef(_,id);
  if ((this->inst_).opcode == 0x56) {
    uVar2 = Instruction::GetOperandAs<int>(this,2);
    this = ValidationState_t::FindDef(_,uVar2);
  }
  if ((this->inst_).opcode == 0x3d) {
    uVar2 = Instruction::GetOperandAs<int>(this,2);
    bVar1 = ValidationState_t::HasDecoration(_,uVar2,decor);
    if (bVar1) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,"Missing decoration ",0x13);
    ValidationState_t::SpvDecorationString_abi_cxx11_(&local_220,_,decor);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,local_220._M_dataplus._M_p,local_220._M_string_length);
    sVar3 = local_200.error_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,"Expect to see OpLoad",0x14);
    sVar3 = local_200.error_;
  }
  DiagnosticStream::~DiagnosticStream(&local_200);
  return sVar3;
}

Assistant:

spv_result_t ValidateImageProcessingQCOMDecoration(ValidationState_t& _, int id,
                                                   spv::Decoration decor) {
  const Instruction* si_inst = nullptr;
  const Instruction* ld_inst = _.FindDef(id);
  bool is_intf_obj = (ld_inst->opcode() == spv::Op::OpSampledImage);
  if (is_intf_obj == true) {
    si_inst = ld_inst;
    int t_idx = si_inst->GetOperandAs<int>(2);  // texture
    ld_inst = _.FindDef(t_idx);
  }
  if (ld_inst->opcode() != spv::Op::OpLoad) {
    return _.diag(SPV_ERROR_INVALID_DATA, ld_inst) << "Expect to see OpLoad";
  }
  int texture_id = ld_inst->GetOperandAs<int>(2);  // variable to load
  if (!_.HasDecoration(texture_id, decor)) {
    return _.diag(SPV_ERROR_INVALID_DATA, ld_inst)
           << "Missing decoration " << _.SpvDecorationString(decor);
  }

  return SPV_SUCCESS;
}